

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall ParserProbModelXML::SetISD(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  FSDist_COF *this_00;
  ulong uVar4;
  long lVar5;
  ostream *poVar6;
  xmlXPathObjectPtr pxVar7;
  long lVar8;
  char *__s;
  xmlNodePtr pxVar9;
  vector<double,_std::allocator<double>_> *this_01;
  const_reference pvVar10;
  EParse *pEVar11;
  int j;
  ParserProbModelXML *this_02;
  ulong uVar12;
  size_t j_1;
  size_t j_2;
  undefined1 in_XMM2 [16];
  string CPD_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string factor_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [32];
  stringstream xpath_ss;
  ostream local_1a8 [376];
  
  this_00 = (FSDist_COF *)operator_new(0x48);
  FSDist_COF::FSDist_COF
            (this_00,(MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)
                     (&(this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                       super_MultiAgentDecisionProcess.field_0x0 +
                     *(long *)(*(long *)&(this->_m_fDecPOMDP->
                                         super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                         super_MultiAgentDecisionProcess + -0x48)));
  uVar12 = 0;
  do {
    uVar4 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                   super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0xa8))();
    if (uVar4 <= uVar12) {
      FSDist_COF::SanityCheck(this_00);
      (this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_S.
      _m_initialStateDistribution = (FactoredStateDistribution *)this_00;
      return;
    }
    lVar5 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                   super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 200))
                      (this->_m_fDecPOMDP,uVar12 & 0xffffffff);
    std::__cxx11::string::string((string *)&factor_name,(string *)(lVar5 + 8));
    std::__cxx11::stringstream::stringstream((stringstream *)&xpath_ss);
    std::operator<<(local_1a8,
                    "/ProbModelXML/ProbNet/Potentials/Potential[@role=\'conditionalProbability\']/Variables/Variable"
                   );
    poVar6 = std::operator<<(local_1a8,"[starts-with(@name, \"");
    poVar6 = std::operator<<(poVar6,(string *)&factor_name);
    std::operator<<(poVar6,"\") and @timeSlice=\'0\']");
    std::__cxx11::stringbuf::str();
    pxVar7 = GetNodesMatchingExpression(this,(xmlChar *)CPD_type._M_dataplus._M_p,(xmlNodePtr)0x0);
    std::__cxx11::string::~string((string *)&CPD_type);
    if (pxVar7 == (xmlXPathObjectPtr)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Warning: Variable ");
      poVar6 = std::operator<<(poVar6,(string *)&factor_name);
      poVar6 = std::operator<<(poVar6," has no ISD. Setting to uniform. ");
      std::endl<char,std::char_traits<char>>(poVar6);
LAB_0049de7d:
      lVar5 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0xc0))
                        (this->_m_fDecPOMDP,uVar12 & 0xffffffff);
      auVar2 = vcvtusi2ss_avx512f(in_XMM2,lVar5);
      for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
        FSDist_COF::SetProbability(this_00,(Index)uVar12,(Index)lVar8,1.0 / (double)auVar2._0_4_);
      }
    }
    else {
      pxVar1 = pxVar7->nodesetval;
      lVar5 = 0;
      pxVar9 = *pxVar1->nodeTab;
      do {
        if (pxVar1->nodeNr <= lVar5) break;
        pxVar9 = pxVar1->nodeTab[lVar5];
        lVar8 = xmlChildElementCount(pxVar9->parent);
        lVar5 = lVar5 + 1;
      } while (lVar8 != 1);
      lVar5 = xmlChildElementCount(pxVar9->parent);
      if (lVar5 != 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Warning: Variable ");
        poVar6 = std::operator<<(poVar6,(string *)&factor_name);
        poVar6 = std::operator<<(poVar6," has no ISD. Setting to uniform. ");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      __s = (char *)xmlGetProp(pxVar9->parent->parent,"type");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&CPD_type,__s,(allocator<char> *)&local_298);
      bVar3 = std::operator==(&CPD_type,"Table");
      if (bVar3) {
        pxVar9 = pxVar9->parent->parent;
        this_02 = (ParserProbModelXML *)local_1d8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1d8,"Values",(allocator<char> *)&local_298);
        pxVar9 = FindChild(this_02,pxVar9,(string *)local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        if (pxVar9 == (xmlNodePtr)0x0) {
          pEVar11 = (EParse *)__cxa_allocate_exception(0x28);
          std::operator+(&local_298,"Variable ",&factor_name);
          std::operator+(&local_1f8,&local_298," has an empty ISD");
          EParse::EParse(pEVar11,&local_1f8);
          __cxa_throw(pEVar11,&EParse::typeinfo,E::~E);
        }
        this_01 = ParseArray(this,pxVar9);
        for (uVar4 = 0;
            uVar4 < (ulong)((long)(this_01->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_01->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1)
        {
          pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_01,uVar4);
          FSDist_COF::SetProbability(this_00,(Index)uVar12,(Index)uVar4,*pvVar10);
        }
      }
      else {
        bVar3 = std::operator==(&CPD_type,"Uniform");
        if (bVar3) {
          std::__cxx11::string::~string((string *)&CPD_type);
          goto LAB_0049de7d;
        }
        bVar3 = std::operator==(&CPD_type,"Tree/ADD");
        if (bVar3) {
          pEVar11 = (EParse *)__cxa_allocate_exception(0x28);
          std::operator+(&local_258,"At variable ",&factor_name);
          std::operator+(&local_238,&local_258,": CPD type \"");
          std::operator+(&local_298,&local_238,&CPD_type);
          std::operator+(&local_218,&local_298,"\" not allowed for initial belief.");
          EParse::EParse(pEVar11,&local_218);
          __cxa_throw(pEVar11,&EParse::typeinfo,E::~E);
        }
      }
      std::__cxx11::string::~string((string *)&CPD_type);
      if (lVar5 != 1) goto LAB_0049de7d;
    }
    xmlXPathFreeObject(pxVar7);
    std::__cxx11::stringstream::~stringstream((stringstream *)&xpath_ss);
    std::__cxx11::string::~string((string *)&factor_name);
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void ParserProbModelXML::SetISD()
{
    FSDist_COF* isd = new FSDist_COF(*_m_fDecPOMDP);
    for(size_t i = 0; i < _m_fDecPOMDP->GetNrStateFactors(); i++)
    {
        bool setUniform = false;
        string factor_name = _m_fDecPOMDP->GetStateFactorDiscrete(i)->GetName();
        stringstream xpath_ss; 
        xpath_ss << "/ProbModelXML/ProbNet/Potentials/Potential[@role='conditionalProbability']/Variables/Variable";
        xpath_ss << "[starts-with(@name, \"" << factor_name << "\") and @timeSlice='0']";
        xmlXPathObjectPtr isd_nodes = GetNodesMatchingExpression((xmlChar*) xpath_ss.str().c_str());
        if(isd_nodes == NULL)
        {
            cout << "Warning: Variable " << factor_name << " has no ISD. Setting to uniform. " << endl;
            setUniform = true;
        }
        else
        {
            xmlNodeSetPtr isd_nodeset = isd_nodes->nodesetval;
            xmlNodePtr isd_node = isd_nodeset->nodeTab[0];
            for(int j = 0; j < isd_nodeset->nodeNr; j++)
            {
                isd_node = isd_nodeset->nodeTab[j];
                xmlNodePtr p = isd_node->parent;
                if(xmlChildElementCount(p) == 1)
                    break; //ISD nodes are one-dimensional arrays
            }
            if(xmlChildElementCount(isd_node->parent) != 1)
            {
                cout << "Warning: Variable " << factor_name << " has no ISD. Setting to uniform. " << endl;
                setUniform = true;
            }
            string CPD_type = (char*) xmlGetProp(isd_node->parent->parent, (xmlChar*) "type"); //Potential
            if(CPD_type == "Table")
            {
                xmlNodePtr data_node = FindChild(isd_node->parent->parent, "Values");
                if(data_node == NULL)
                    throw EParse("Variable " + factor_name + " has an empty ISD");
                const vector<double>* dist = ParseArray(data_node);
                for(size_t j = 0; j < dist->size(); j++)
                {
                    isd->SetProbability(i, j, dist->at(j));
                }
            }
            else if(CPD_type == "Uniform")
            {
                setUniform = true;
            }
            else if(CPD_type == "Tree/ADD")
            {
                throw EParse("At variable " + factor_name + ": CPD type \"" + CPD_type + "\" not allowed for initial belief.");
            }
        }
        if(setUniform)
        {
            size_t n = _m_fDecPOMDP->GetNrValuesForFactor(i);
            for(size_t j = 0; j < n; j++)
            {
                isd->SetProbability(i, j, 1.0/(float) n);
            }
        }

        xmlXPathFreeObject (isd_nodes);
    }

    isd->SanityCheck();
    _m_fDecPOMDP->SetISD(isd);
  
    return;
}